

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fast_float.h
# Opt level: O2

adjusted_mantissa
duckdb_fast_float::compute_float<duckdb_fast_float::binary_format<float>>(decimal *d)

{
  uint uVar1;
  ulong extraout_RAX;
  ulong extraout_RAX_00;
  ulong uVar2;
  uint32_t uVar3;
  int iVar4;
  ulong uVar5;
  double __x;
  double __x_00;
  adjusted_mantissa aVar6;
  
  if ((d->num_digits != 0) && (uVar1 = d->decimal_point, -0x145 < (int)uVar1)) {
    uVar2 = 0xff;
    iVar4 = 0;
    if (0x135 < (int)uVar1) goto LAB_0165ce22;
    do {
      if ((int)uVar1 < 1) {
        uVar5 = 0;
        goto LAB_0165ce84;
      }
      uVar3 = 0x3c;
      if (uVar1 < 0x13) {
        uVar3 = (uint32_t)""[uVar1];
      }
      detail::decimal_right_shift(d,uVar3);
      uVar1 = d->decimal_point;
      iVar4 = iVar4 + uVar3;
    } while (-0x800 < (int)uVar1);
  }
  uVar2 = 0;
  goto LAB_0165ce22;
LAB_0165ce84:
  if (0 < (int)uVar1) goto LAB_0165cece;
  if (uVar1 == 0) {
    if (4 < d->digits[0]) goto LAB_0165cece;
    uVar3 = (d->digits[0] < 2) + 1;
  }
  else {
    uVar3 = 0x3c;
    if (-uVar1 < 0x13) {
      uVar3 = (uint32_t)""[-uVar1];
    }
  }
  detail::decimal_left_shift(d,uVar3);
  uVar1 = d->decimal_point;
  if (0x7ff < (int)uVar1) goto LAB_0165ce25;
  iVar4 = iVar4 - uVar3;
  goto LAB_0165ce84;
LAB_0165cece:
  for (iVar4 = iVar4 + -1; iVar4 < -0x7e; iVar4 = iVar4 + uVar3) {
    uVar3 = -iVar4 - 0x7e;
    if (0x3b < uVar3) {
      uVar3 = 0x3c;
    }
    detail::decimal_right_shift(d,uVar3);
  }
  if (iVar4 + 0x7fU < 0xff) {
    detail::decimal_left_shift(d,0x18);
    detail::round(__x);
    uVar5 = extraout_RAX;
    if (0xffffff < extraout_RAX) {
      detail::decimal_right_shift(d,1);
      detail::round(__x_00);
      if (0xfe < iVar4 + 0x80U) goto LAB_0165ce22;
      iVar4 = iVar4 + 1;
      uVar5 = extraout_RAX_00;
    }
    uVar2 = (ulong)((0x7f - (uint)(uVar5 < 0x800000)) + iVar4);
    uVar5 = (ulong)((uint)uVar5 & 0x7fffff);
    goto LAB_0165ce25;
  }
LAB_0165ce22:
  uVar5 = 0;
LAB_0165ce25:
  aVar6._8_8_ = uVar2;
  aVar6.mantissa = uVar5;
  return aVar6;
}

Assistant:

adjusted_mantissa compute_float(decimal &d) {
  adjusted_mantissa answer;
  if (d.num_digits == 0) {
    // should be zero
    answer.power2 = 0;
    answer.mantissa = 0;
    return answer;
  }
  // At this point, going further, we can assume that d.num_digits > 0.
  //
  // We want to guard against excessive decimal point values because
  // they can result in long running times. Indeed, we do
  // shifts by at most 60 bits. We have that log(10**400)/log(2**60) ~= 22
  // which is fine, but log(10**299995)/log(2**60) ~= 16609 which is not
  // fine (runs for a long time).
  //
  if(d.decimal_point < -324) {
    // We have something smaller than 1e-324 which is always zero
    // in binary64 and binary32.
    // It should be zero.
    answer.power2 = 0;
    answer.mantissa = 0;
    return answer;
  } else if(d.decimal_point >= 310) {
    // We have something at least as large as 0.1e310 which is
    // always infinite.  
    answer.power2 = binary::infinite_power();
    answer.mantissa = 0;
    return answer;
  }
  static const uint32_t max_shift = 60;
  static const uint32_t num_powers = 19;
  static const uint8_t decimal_powers[19] = {
      0,  3,  6,  9,  13, 16, 19, 23, 26, 29, //
      33, 36, 39, 43, 46, 49, 53, 56, 59,     //
  };
  int32_t exp2 = 0;
  while (d.decimal_point > 0) {
    uint32_t n = uint32_t(d.decimal_point);
    uint32_t shift = (n < num_powers) ? decimal_powers[n] : max_shift;
    detail::decimal_right_shift(d, shift);
    if (d.decimal_point < -decimal_point_range) {
      // should be zero
      answer.power2 = 0;
      answer.mantissa = 0;
      return answer;
    }
    exp2 += int32_t(shift);
  }
  // We shift left toward [1/2 ... 1].
  while (d.decimal_point <= 0) {
    uint32_t shift;
    if (d.decimal_point == 0) {
      if (d.digits[0] >= 5) {
        break;
      }
      shift = (d.digits[0] < 2) ? 2 : 1;
    } else {
      uint32_t n = uint32_t(-d.decimal_point);
      shift = (n < num_powers) ? decimal_powers[n] : max_shift;
    }
    detail::decimal_left_shift(d, shift);
    if (d.decimal_point > decimal_point_range) {
      // we want to get infinity:
      answer.power2 = binary::infinite_power();
      answer.mantissa = 0;
      return answer;
    }
    exp2 -= int32_t(shift);
  }
  // We are now in the range [1/2 ... 1] but the binary format uses [1 ... 2].
  exp2--;
  constexpr int32_t minimum_exponent = binary::minimum_exponent();
  while ((minimum_exponent + 1) > exp2) {
    uint32_t n = uint32_t((minimum_exponent + 1) - exp2);
    if (n > max_shift) {
      n = max_shift;
    }
    detail::decimal_right_shift(d, n);
    exp2 += int32_t(n);
  }
  if ((exp2 - minimum_exponent) >= binary::infinite_power()) {
    answer.power2 = binary::infinite_power();
    answer.mantissa = 0;
    return answer;
  }

  const int mantissa_size_in_bits = binary::mantissa_explicit_bits() + 1;
  detail::decimal_left_shift(d, mantissa_size_in_bits);

  uint64_t mantissa = detail::round(d);
  // It is possible that we have an overflow, in which case we need
  // to shift back.
  if(mantissa >= (uint64_t(1) << mantissa_size_in_bits)) {
    detail::decimal_right_shift(d, 1);
    exp2 += 1;
    mantissa = detail::round(d);
    if ((exp2 - minimum_exponent) >= binary::infinite_power()) {
      answer.power2 = binary::infinite_power();
      answer.mantissa = 0;
      return answer;
    }
  }
  answer.power2 = exp2  - binary::minimum_exponent();
  if(mantissa < (uint64_t(1) << binary::mantissa_explicit_bits())) { answer.power2--; }
  answer.mantissa = mantissa & ((uint64_t(1) << binary::mantissa_explicit_bits()) - 1);
  return answer;
}